

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

void Abc_NtkOrderCisCos(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  pNtk->vCis->nSize = 0;
  pNtk->vCos->nSize = 0;
  pVVar5 = pNtk->vPis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar8];
      pVVar5 = pNtk->vCis;
      uVar1 = pVVar5->nCap;
      if (pVVar5->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar4;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar1 * 2;
          if (iVar7 <= (int)uVar1) goto LAB_0086a5ee;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
          pVVar5->pArray = ppvVar4;
        }
        pVVar5->nCap = iVar7;
      }
LAB_0086a5ee:
      iVar7 = pVVar5->nSize;
      pVVar5->nSize = iVar7 + 1;
      pVVar5->pArray[iVar7] = pvVar2;
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vPis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vPos;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar8];
      pVVar5 = pNtk->vCos;
      uVar1 = pVVar5->nCap;
      if (pVVar5->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar4;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar1 * 2;
          if (iVar7 <= (int)uVar1) goto LAB_0086a6a7;
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
          }
          pVVar5->pArray = ppvVar4;
        }
        pVVar5->nCap = iVar7;
      }
LAB_0086a6a7:
      iVar7 = pVVar5->nSize;
      pVVar5->nSize = iVar7 + 1;
      pVVar5->pArray[iVar7] = pvVar2;
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vPos;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar5->pArray[lVar8];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 8) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar6 * 4) * 8);
            pVVar5 = pNtk->vCos;
            uVar1 = pVVar5->nCap;
            if (pVVar5->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = ppvVar4;
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar1 * 2;
                if (iVar7 <= (int)uVar1) goto LAB_0086a793;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
                pVVar5->pArray = ppvVar4;
              }
              pVVar5->nCap = iVar7;
            }
LAB_0086a793:
            iVar7 = pVVar5->nSize;
            pVVar5->nSize = iVar7 + 1;
            pVVar5->pArray[iVar7] = pvVar2;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)((long)plVar3 + 0x1c));
        }
        if (0 < *(int *)((long)plVar3 + 0x2c)) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar6 * 4) * 8);
            pVVar5 = pNtk->vCis;
            uVar1 = pVVar5->nCap;
            if (pVVar5->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = ppvVar4;
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar1 * 2;
                if (iVar7 <= (int)uVar1) goto LAB_0086a84b;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
                pVVar5->pArray = ppvVar4;
              }
              pVVar5->nCap = iVar7;
            }
LAB_0086a84b:
            iVar7 = pVVar5->nSize;
            pVVar5->nSize = iVar7 + 1;
            pVVar5->pArray[iVar7] = pvVar2;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)((long)plVar3 + 0x2c));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vBoxes;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vBoxes;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      plVar3 = (long *)pVVar5->pArray[lVar8];
      if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
        if (0 < *(int *)((long)plVar3 + 0x1c)) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[4] + lVar6 * 4) * 8);
            pVVar5 = pNtk->vCos;
            uVar1 = pVVar5->nCap;
            if (pVVar5->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = ppvVar4;
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar1 * 2;
                if (iVar7 <= (int)uVar1) goto LAB_0086a947;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
                pVVar5->pArray = ppvVar4;
              }
              pVVar5->nCap = iVar7;
            }
LAB_0086a947:
            iVar7 = pVVar5->nSize;
            pVVar5->nSize = iVar7 + 1;
            pVVar5->pArray[iVar7] = pvVar2;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)((long)plVar3 + 0x1c));
        }
        if (0 < *(int *)((long)plVar3 + 0x2c)) {
          lVar6 = 0;
          do {
            pvVar2 = *(void **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)(plVar3[6] + lVar6 * 4) * 8);
            pVVar5 = pNtk->vCis;
            uVar1 = pVVar5->nCap;
            if (pVVar5->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,0x80);
                }
                pVVar5->pArray = ppvVar4;
                iVar7 = 0x10;
              }
              else {
                iVar7 = uVar1 * 2;
                if (iVar7 <= (int)uVar1) goto LAB_0086a9ff;
                if (pVVar5->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(pVVar5->pArray,(ulong)uVar1 << 4);
                }
                pVVar5->pArray = ppvVar4;
              }
              pVVar5->nCap = iVar7;
            }
LAB_0086a9ff:
            iVar7 = pVVar5->nSize;
            pVVar5->nSize = iVar7 + 1;
            pVVar5->pArray[iVar7] = pvVar2;
            lVar6 = lVar6 + 1;
          } while (lVar6 < *(int *)((long)plVar3 + 0x2c));
        }
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vBoxes;
    } while (lVar8 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Abc_NtkOrderCisCos( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pTerm;
    int i, k;
    Vec_PtrClear( pNtk->vCis );
    Vec_PtrClear( pNtk->vCos );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCis, pObj );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Vec_PtrPush( pNtk->vCos, pObj );
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
    Abc_NtkForEachBox( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        Abc_ObjForEachFanin( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCos, pTerm );
        Abc_ObjForEachFanout( pObj, pTerm, k )
            Vec_PtrPush( pNtk->vCis, pTerm );
    }
}